

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O2

upb_MiniTable *
upb_MtDecoder_BuildMiniTableWithBuf
          (upb_MtDecoder *decoder,char *data,size_t len,void **buf,size_t *buf_size)

{
  upb_LayoutItemType *puVar1;
  uint8_t *puVar2;
  char cVar3;
  ushort uVar4;
  uint16_t uVar5;
  undefined2 uVar6;
  size_t __nmemb;
  upb_MiniTableField *puVar7;
  int iVar8;
  upb_LayoutItem *item;
  upb_MiniTable *puVar9;
  byte *pbVar10;
  upb_LayoutItem *puVar11;
  upb_LayoutItem *puVar12;
  upb_LayoutItem *puVar13;
  byte *pbVar14;
  upb_MiniTableField *puVar15;
  char *fmt;
  upb_LayoutItem *puVar16;
  size_t sVar17;
  long lVar18;
  int i;
  ulong uVar19;
  bool bVar20;
  upb_LayoutItem item_00;
  
  iVar8 = _setjmp((__jmp_buf_tag *)(decoder->base).err);
  if (iVar8 == 0) {
    upb_MdDecoder_CheckOutOfMemory(&decoder->base,decoder->table);
    puVar9 = decoder->table;
    puVar9->size_dont_copy_me__upb_internal_use_only = 8;
    puVar9->field_count_dont_copy_me__upb_internal_use_only = 0;
    puVar9->ext_dont_copy_me__upb_internal_use_only = '\0';
    puVar9->dense_below_dont_copy_me__upb_internal_use_only = '\0';
    puVar9->table_mask_dont_copy_me__upb_internal_use_only = 0xff;
    puVar9->required_count_dont_copy_me__upb_internal_use_only = '\0';
    sVar17 = len - 1;
    if (len != 0) {
      cVar3 = *data;
      if (cVar3 == '$') {
        upb_MtDecoder_ParseMessage(decoder,data + 1,sVar17);
        upb_MtDecoder_AssignHasbits(decoder);
        uVar4 = decoder->table->field_count_dont_copy_me__upb_internal_use_only;
        lVar18 = 0xb;
        for (uVar19 = 0; uVar4 != uVar19; uVar19 = uVar19 + 1) {
          if (*(ushort *)((long)decoder->fields + lVar18 + -7) < 3) {
            item_00._0_8_ =
                 ((ulong)(*(byte *)((long)&decoder->fields->
                                           number_dont_copy_me__upb_internal_use_only + lVar18) >> 6
                         ) << 0x20) + uVar19;
            item_00.type = kUpb_LayoutItemType_Field;
            upb_MtDecoder_PushItem(decoder,item_00);
          }
          lVar18 = lVar18 + 0xc;
        }
        __nmemb = (decoder->vec).size;
        if (__nmemb == 0) {
          sVar17 = 0;
        }
        else {
          qsort((decoder->vec).data,__nmemb,0xc,upb_MtDecoder_CompareFields);
          sVar17 = (decoder->vec).size;
        }
        puVar12 = (decoder->vec).data;
        puVar16 = puVar12 + sVar17;
        for (puVar13 = puVar12; puVar11 = puVar12, puVar13 < puVar16; puVar13 = puVar13 + 1) {
          uVar19 = (ulong)puVar13->rep;
          bVar20 = decoder->platform == kUpb_MiniTablePlatform_32Bit;
          pbVar10 = &upb_MtDecoder_SizeOfRep_kRepToSize64 + uVar19;
          if (bVar20) {
            pbVar10 = &upb_MtDecoder_AlignOfRep_kRepToAlign64 + uVar19;
          }
          pbVar14 = (byte *)((long)&upb_MtDecoder_AlignOfRep_kRepToAlign32 + uVar19);
          if (!bVar20) {
            pbVar14 = &upb_MtDecoder_AlignOfRep_kRepToAlign64 + uVar19;
          }
          uVar19 = ((ulong)decoder->table->size_dont_copy_me__upb_internal_use_only +
                   (ulong)*pbVar14) - 1;
          lVar18 = uVar19 - uVar19 % (ulong)*pbVar14;
          uVar19 = (ulong)*pbVar10 + lVar18;
          if (0xffff < uVar19) {
            upb_MdDecoder_ErrorJmp
                      (&decoder->base,"Message size exceeded maximum size of %zu bytes",0xffff);
          }
          decoder->table->size_dont_copy_me__upb_internal_use_only = (uint16_t)uVar19;
          puVar13->offset = (uint16_t)lVar18;
        }
        for (; puVar11 < puVar16; puVar11 = puVar11 + 1) {
          if (puVar11->type == kUpb_LayoutItemType_OneofCase) {
            puVar7 = decoder->fields;
            uVar19 = (ulong)puVar11->field_index;
            uVar4 = puVar11->offset;
            while( true ) {
              puVar7[uVar19].presence = ~uVar4;
              uVar19 = (ulong)puVar7[uVar19].offset_dont_copy_me__upb_internal_use_only;
              if (uVar19 == 0xffff) break;
              uVar19 = uVar19 - 3;
              if ((int)(uint)decoder->table->field_count_dont_copy_me__upb_internal_use_only <=
                  (int)uVar19) {
                __assert_fail("f->offset_dont_copy_me__upb_internal_use_only - kOneofBase < d->table->field_count_dont_copy_me__upb_internal_use_only"
                              ,
                              "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/upb/mini_descriptor/decode.c"
                              ,0x270,"void upb_MtDecoder_AssignOffsets(upb_MtDecoder *)");
              }
            }
          }
        }
        for (; puVar12 < puVar16; puVar12 = puVar12 + 1) {
          puVar7 = decoder->fields;
          puVar15 = puVar7 + puVar12->field_index;
          if (puVar12->type == kUpb_LayoutItemType_Field) {
            puVar15->offset_dont_copy_me__upb_internal_use_only = puVar12->offset;
          }
          else if (puVar12->type == kUpb_LayoutItemType_OneofField) {
            uVar5 = puVar12->offset;
            while( true ) {
              uVar4 = puVar15->offset_dont_copy_me__upb_internal_use_only;
              puVar15->offset_dont_copy_me__upb_internal_use_only = uVar5;
              if ((ulong)uVar4 == 0xffff) break;
              puVar15 = puVar7 + ((ulong)uVar4 - 3);
            }
          }
        }
        uVar6 = decoder->table->size_dont_copy_me__upb_internal_use_only;
        decoder->table->size_dont_copy_me__upb_internal_use_only = uVar6 + 7 & 0xfff8;
      }
      else if (cVar3 == '&') {
        if (sVar17 != 0) {
          upb_MdDecoder_ErrorJmp(&decoder->base,"Invalid message set encode length: %zu",sVar17);
        }
        puVar9->ext_dont_copy_me__upb_internal_use_only = '\x02';
        puVar9->dense_below_dont_copy_me__upb_internal_use_only = '\0';
        puVar9->table_mask_dont_copy_me__upb_internal_use_only = 0xff;
        puVar9->required_count_dont_copy_me__upb_internal_use_only = '\0';
      }
      else {
        if (cVar3 != '%') {
          uVar19 = (ulong)(uint)(int)cVar3;
          fmt = "Invalid message version: %c";
LAB_00127312:
          upb_MdDecoder_ErrorJmp(&decoder->base,fmt,uVar19);
        }
        upb_MtDecoder_ParseMessage(decoder,data + 1,sVar17);
        upb_MtDecoder_AssignHasbits(decoder);
        uVar4 = decoder->table->field_count_dont_copy_me__upb_internal_use_only;
        uVar19 = (ulong)uVar4;
        if (uVar4 != 2) {
          fmt = "%hu fields in map";
          goto LAB_00127312;
        }
        puVar12 = (decoder->vec).data;
        puVar13 = puVar12;
        while (puVar13 < puVar12 + (decoder->vec).size) {
          puVar1 = &puVar13->type;
          puVar13 = puVar13 + 1;
          if (*puVar1 == kUpb_LayoutItemType_OneofCase) {
            upb_MdDecoder_ErrorJmp(&decoder->base,"Map entry cannot have oneof");
          }
        }
        upb_MtDecoder_ValidateEntryField
                  (decoder,decoder->table->fields_dont_copy_me__upb_internal_use_only,1);
        upb_MtDecoder_ValidateEntryField
                  (decoder,decoder->table->fields_dont_copy_me__upb_internal_use_only + 1,2);
        puVar7 = decoder->fields;
        puVar7->offset_dont_copy_me__upb_internal_use_only = 0x10;
        puVar7[1].offset_dont_copy_me__upb_internal_use_only = 0x20;
        puVar9 = decoder->table;
        puVar9->size_dont_copy_me__upb_internal_use_only = 0x30;
        puVar2 = &puVar9->ext_dont_copy_me__upb_internal_use_only;
        *puVar2 = *puVar2 | 4;
      }
    }
    *buf = (decoder->vec).data;
    *buf_size = (decoder->vec).capacity * 0xc;
    puVar9 = decoder->table;
  }
  else {
    *buf = (decoder->vec).data;
    *buf_size = (decoder->vec).capacity * 0xc;
    puVar9 = (upb_MiniTable *)0x0;
  }
  return puVar9;
}

Assistant:

static upb_MiniTable* upb_MtDecoder_BuildMiniTableWithBuf(
    upb_MtDecoder* const decoder, const char* const data, const size_t len,
    void** const buf, size_t* const buf_size) {
  if (UPB_SETJMP(decoder->base.err) != 0) {
    *buf = decoder->vec.data;
    *buf_size = decoder->vec.capacity * sizeof(*decoder->vec.data);
    return NULL;
  }

  return upb_MtDecoder_DoBuildMiniTableWithBuf(decoder, data, len, buf,
                                               buf_size);
}